

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::IsExecutionModelValidForRtBuiltIn
               (BuiltIn builtin,ExecutionModel stage)

{
  ExecutionModel stage_local;
  BuiltIn builtin_local;
  
  if (builtin == BuiltInInstanceId) {
LAB_0029e00b:
    if (2 < stage - ExecutionModelIntersectionKHR) {
      return false;
    }
    return true;
  }
  if (builtin - BuiltInLaunchIdKHR < 2) {
    if (5 < stage - ExecutionModelRayGenerationKHR) {
      return false;
    }
    return true;
  }
  if (1 < builtin - BuiltInWorldRayOriginKHR) {
    if (builtin - BuiltInObjectRayOriginKHR < 2) goto LAB_0029e00b;
    if (1 < builtin - BuiltInRayTminKHR) {
      if ((builtin == BuiltInInstanceCustomIndexKHR) || (builtin - BuiltInObjectToWorldKHR < 2))
      goto LAB_0029e00b;
      if (builtin - BuiltInHitTNV < 2) {
        if ((stage != AnyHitKHR) && (stage != ClosestHitKHR)) {
          return false;
        }
        return true;
      }
      if (builtin != BuiltInIncomingRayFlagsKHR) {
        if (builtin == BuiltInRayGeometryIndexKHR) goto LAB_0029e00b;
        if (builtin != BuiltInCullMaskKHR) {
          return false;
        }
      }
    }
  }
  return stage - ExecutionModelIntersectionKHR < 4;
}

Assistant:

bool IsExecutionModelValidForRtBuiltIn(spv::BuiltIn builtin,
                                       spv::ExecutionModel stage) {
  switch (builtin) {
    case spv::BuiltIn::HitKindKHR:
    case spv::BuiltIn::HitTNV:
      if (stage == spv::ExecutionModel::AnyHitKHR ||
          stage == spv::ExecutionModel::ClosestHitKHR) {
        return true;
      }
      break;
    case spv::BuiltIn::InstanceCustomIndexKHR:
    case spv::BuiltIn::InstanceId:
    case spv::BuiltIn::RayGeometryIndexKHR:
    case spv::BuiltIn::ObjectRayDirectionKHR:
    case spv::BuiltIn::ObjectRayOriginKHR:
    case spv::BuiltIn::ObjectToWorldKHR:
    case spv::BuiltIn::WorldToObjectKHR:
      switch (stage) {
        case spv::ExecutionModel::IntersectionKHR:
        case spv::ExecutionModel::AnyHitKHR:
        case spv::ExecutionModel::ClosestHitKHR:
          return true;
        default:
          return false;
      }
      break;
    case spv::BuiltIn::IncomingRayFlagsKHR:
    case spv::BuiltIn::RayTminKHR:
    case spv::BuiltIn::RayTmaxKHR:
    case spv::BuiltIn::WorldRayDirectionKHR:
    case spv::BuiltIn::WorldRayOriginKHR:
    case spv::BuiltIn::CullMaskKHR:
      switch (stage) {
        case spv::ExecutionModel::IntersectionKHR:
        case spv::ExecutionModel::AnyHitKHR:
        case spv::ExecutionModel::ClosestHitKHR:
        case spv::ExecutionModel::MissKHR:
          return true;
        default:
          return false;
      }
      break;
    case spv::BuiltIn::LaunchIdKHR:
    case spv::BuiltIn::LaunchSizeKHR:
      switch (stage) {
        case spv::ExecutionModel::RayGenerationKHR:
        case spv::ExecutionModel::IntersectionKHR:
        case spv::ExecutionModel::AnyHitKHR:
        case spv::ExecutionModel::ClosestHitKHR:
        case spv::ExecutionModel::MissKHR:
        case spv::ExecutionModel::CallableKHR:
          return true;
        default:
          return false;
      }
      break;
    default:
      break;
  }
  return false;
}